

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O3

void __thiscall
duckdb::MergeSorter::MergeData
          (MergeSorter *this,SortedData *result_data,SortedData *l_data,SortedData *r_data,
          idx_t *count,bool *left_smaller,idx_t *next_entry_sizes,bool reset_indices)

{
  idx_t *l_entry_idx;
  idx_t *r_entry_idx;
  bool bVar1;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var2;
  idx_t iVar3;
  pointer puVar4;
  pointer puVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  data_ptr_t pdVar10;
  RowDataBlock *pRVar11;
  bool *pbVar12;
  type this_00;
  type this_01;
  reference pvVar13;
  MergeSorter *pMVar14;
  pointer pRVar15;
  ulong uVar16;
  pointer pSVar17;
  data_ptr_t *source_data_ptr;
  int *piVar18;
  idx_t *piVar19;
  int *piVar20;
  idx_t new_capacity;
  MergeSorter *pMVar21;
  optional_ptr<duckdb::FileBuffer,_true> *this_02;
  data_ptr_t pdVar22;
  idx_t iVar23;
  int iVar24;
  idx_t *source_entry_idx;
  int **source_heap_ptr;
  ulong uVar25;
  int *piVar26;
  idx_t iVar27;
  idx_t iVar28;
  ulong uVar29;
  size_t sVar30;
  data_ptr_t pdVar31;
  RowDataBlock *local_1d8;
  data_ptr_t local_1a0;
  SortedData *local_198;
  ulong *local_190;
  data_ptr_t r_ptr;
  data_ptr_t l_ptr;
  SortedData *local_178;
  RowDataBlock *local_170;
  int *local_168;
  idx_t local_160;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_158;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_150;
  bool *local_148;
  idx_t local_140;
  idx_t local_138;
  data_ptr_t local_130;
  GlobalSortState **local_128;
  GlobalSortState **local_120;
  idx_t local_118;
  idx_t copied_copy;
  idx_t copied;
  BufferHandle result_heap_handle;
  int *local_d8;
  idx_t row_width;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_c8;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_c0;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_b8;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_b0;
  long local_a8;
  long local_a0;
  RowLayout *local_98;
  idx_t local_90;
  data_ptr_t result_data_ptr_copy;
  idx_t r_idx_copy;
  idx_t l_idx_copy;
  BufferHandle result_data_handle;
  
  local_c0 = &this->left;
  local_190 = count;
  this_00 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(local_c0);
  local_c8 = &this->right;
  this_01 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(local_c8);
  iVar6 = this_00->block_idx;
  iVar7 = this_00->entry_idx;
  iVar8 = this_01->block_idx;
  iVar9 = this_01->entry_idx;
  iVar28 = (result_data->layout).row_width;
  local_160 = (result_data->layout).heap_pointer_offset;
  local_198 = result_data;
  row_width = iVar28;
  pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
            ::back(&result_data->data_blocks);
  _Var2._M_head_impl =
       (pvVar13->super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
       super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  (*this->buffer_manager->_vptr_BufferManager[7])
            (&result_data_handle,this->buffer_manager,_Var2._M_head_impl);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&result_data_handle.node);
  local_1a0 = (result_data_handle.node.ptr)->buffer + (_Var2._M_head_impl)->count * iVar28;
  local_170 = _Var2._M_head_impl;
  BufferHandle::BufferHandle(&result_heap_handle);
  local_148 = left_smaller;
  local_118 = iVar28;
  if (((local_198->layout).all_constant == false) && (this->state->external == true)) {
    pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::back(&local_198->heap_blocks);
    local_1d8 = (pvVar13->
                super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
                _M_t.
                super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
                .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
    (*this->buffer_manager->_vptr_BufferManager[7])(&copied);
    BufferHandle::operator=(&result_heap_handle,(BufferHandle *)&copied);
    BufferHandle::~BufferHandle((BufferHandle *)&copied);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&result_heap_handle.node);
    local_130 = (result_heap_handle.node.ptr)->buffer + local_1d8->byte_offset;
  }
  else {
    local_1d8 = (RowDataBlock *)0x0;
  }
  copied = 0;
  if (*local_190 != 0) {
    l_entry_idx = &this_00->entry_idx;
    r_entry_idx = &this_01->entry_idx;
    local_98 = &local_198->layout;
    local_120 = &this_00->state;
    local_128 = &this_01->state;
    local_150 = &l_data->data_blocks;
    local_b0 = &l_data->heap_blocks;
    local_158 = &r_data->data_blocks;
    local_b8 = &r_data->heap_blocks;
    local_178 = l_data;
    do {
      iVar28 = copied;
      pMVar14 = (MergeSorter *)l_entry_idx;
      if (this_00->block_idx <
          (ulong)((long)(l_data->data_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(l_data->data_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar3 = *l_entry_idx;
        pMVar14 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_150,this_00->block_idx);
        pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)pMVar14);
        if (iVar3 == pRVar15->count) {
          pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[](local_150,this_00->block_idx);
          pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar13);
          pMVar14 = (MergeSorter *)
                    (pRVar15->block).internal.
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (pRVar15->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar15->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (pMVar14 != (MergeSorter *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar14);
          }
          if (((local_198->layout).all_constant == false) && (this->state->external == true)) {
            pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                      ::operator[](local_b0,this_00->block_idx);
            pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      ::operator->(pvVar13);
            pMVar14 = (MergeSorter *)
                      (pRVar15->block).internal.
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (pRVar15->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pRVar15->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (pMVar14 != (MergeSorter *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar14);
            }
          }
          this_00->block_idx = this_00->block_idx + 1;
          this_00->entry_idx = 0;
        }
      }
      uVar29 = this_01->block_idx;
      if (uVar29 < (ulong)((long)(r_data->data_blocks).
                                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(r_data->data_blocks).
                                 super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar3 = *r_entry_idx;
        pMVar14 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_158,uVar29);
        pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)pMVar14);
        uVar29 = this_01->block_idx;
        if (iVar3 == pRVar15->count) {
          pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[](local_158,uVar29);
          pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar13);
          pMVar14 = (MergeSorter *)
                    (pRVar15->block).internal.
                    super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (pRVar15->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar15->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (pMVar14 != (MergeSorter *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar14);
          }
          if (((local_198->layout).all_constant == false) && (this->state->external == true)) {
            pvVar13 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                      ::operator[](local_b8,this_01->block_idx);
            pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                      ::operator->(pvVar13);
            pMVar14 = (MergeSorter *)
                      (pRVar15->block).internal.
                      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (pRVar15->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pRVar15->block).internal.
            super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (pMVar14 != (MergeSorter *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar14);
            }
          }
          uVar29 = this_01->block_idx + 1;
          this_01->block_idx = uVar29;
          this_01->entry_idx = 0;
        }
      }
      iVar3 = this_00->block_idx;
      iVar23 = (long)(l_data->data_blocks).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(l_data->data_blocks).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      puVar4 = (r_data->data_blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar5 = (r_data->data_blocks).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar3 != iVar23) {
        SBScanState::PinData(this_00,l_data);
        pMVar21 = (MergeSorter *)(local_120 + 0xf);
        if (l_data->type == BLOB) {
          pMVar21 = (MergeSorter *)(local_120 + 9);
        }
        pMVar14 = pMVar21;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                  ((optional_ptr<duckdb::FileBuffer,_true> *)pMVar21);
        l_ptr = (data_ptr_t)
                (*(long *)((long)&(pMVar21->state->lock).super___mutex_base._M_mutex + 8) +
                (l_data->layout).row_width * *l_entry_idx);
      }
      uVar25 = (long)puVar4 - (long)puVar5 >> 3;
      if (uVar29 != uVar25) {
        SBScanState::PinData(this_01,r_data);
        pMVar21 = (MergeSorter *)(local_128 + 0xf);
        if (r_data->type == BLOB) {
          pMVar21 = (MergeSorter *)(local_128 + 9);
        }
        pMVar14 = pMVar21;
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                  ((optional_ptr<duckdb::FileBuffer,_true> *)pMVar21);
        r_ptr = (data_ptr_t)
                (*(long *)((long)&(pMVar21->state->lock).super___mutex_base._M_mutex + 8) +
                (r_data->layout).row_width * *r_entry_idx);
      }
      if (iVar3 == iVar23) {
        iVar27 = 0;
      }
      else {
        pMVar14 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_150,this_00->block_idx);
        pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)pMVar14);
        iVar27 = pRVar15->count;
      }
      local_138 = iVar27;
      if (uVar29 == uVar25) {
        local_140 = 0;
      }
      else {
        pMVar14 = (MergeSorter *)
                  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](local_158,this_01->block_idx);
        pRVar15 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                                *)pMVar14);
        local_140 = pRVar15->count;
      }
      pRVar11 = local_170;
      l_data = local_178;
      pdVar10 = l_ptr;
      pdVar31 = r_ptr;
      pdVar22 = local_1a0;
      if (((local_198->layout).all_constant == false) && (this->state->external != false)) {
        if (iVar3 != iVar23) {
          this_02 = (optional_ptr<duckdb::FileBuffer,_true> *)(local_120 + 0x12);
          if (local_178->type == BLOB) {
            this_02 = (optional_ptr<duckdb::FileBuffer,_true> *)(local_120 + 0xc);
          }
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_02);
          local_168 = (int *)(this_02->ptr->buffer + *(long *)(l_ptr + local_160));
        }
        piVar19 = &local_138;
        source_data_ptr = &l_ptr;
        source_heap_ptr = &local_168;
        source_entry_idx = l_entry_idx;
        if (uVar29 != uVar25) {
          pMVar14 = (MergeSorter *)(local_128 + 0x12);
          if (r_data->type == BLOB) {
            pMVar14 = (MergeSorter *)(local_128 + 0xc);
          }
          pMVar21 = pMVar14;
          optional_ptr<duckdb::FileBuffer,_true>::CheckValid
                    ((optional_ptr<duckdb::FileBuffer,_true> *)pMVar14);
          pbVar12 = local_148;
          pdVar22 = local_1a0;
          piVar26 = (int *)(*(data_ptr_t *)
                             ((long)&(pMVar14->state->lock).super___mutex_base._M_mutex + 8) +
                           *(long *)(r_ptr + local_160));
          piVar19 = &local_140;
          source_data_ptr = &r_ptr;
          source_heap_ptr = &local_d8;
          source_entry_idx = r_entry_idx;
          local_d8 = piVar26;
          if (iVar3 != iVar23) {
            l_idx_copy = *l_entry_idx;
            r_idx_copy = *r_entry_idx;
            result_data_ptr_copy = local_1a0;
            copied_copy = iVar28;
            MergeRows(pMVar21,&l_ptr,&l_idx_copy,&local_138,&r_ptr,&r_idx_copy,&local_140,local_170,
                      &result_data_ptr_copy,&row_width,local_148,&copied_copy,local_190);
            iVar3 = copied_copy;
            local_a0 = copied_copy - iVar28;
            if (local_a0 == 0) {
              local_a8 = 0;
            }
            else {
              local_a8 = 0;
              piVar18 = local_168;
              iVar23 = iVar28;
              piVar20 = piVar26;
              do {
                *(idx_t *)(pdVar22 + local_160) = local_1d8->byte_offset + local_a8;
                uVar29 = (ulong)pbVar12[iVar23];
                iVar24 = 0;
                if (uVar29 == 0) {
                  iVar24 = *piVar20;
                }
                uVar16 = (ulong)(*piVar18 * (uint)pbVar12[iVar23] + iVar24);
                uVar25 = 0;
                if (uVar29 == 0) {
                  uVar25 = uVar16;
                }
                pdVar22 = pdVar22 + local_118;
                next_entry_sizes[iVar23] = uVar16;
                piVar18 = (int *)((long)piVar18 + uVar29 * uVar16);
                piVar20 = (int *)((long)piVar20 + uVar25);
                local_a8 = local_a8 + uVar16;
                iVar23 = iVar23 + 1;
              } while (copied_copy != iVar23);
            }
            iVar23 = local_1d8->byte_offset;
            uVar29 = iVar23 + local_a8;
            pdVar31 = local_130;
            local_1a0 = pdVar22;
            if (local_1d8->capacity < uVar29) {
              (*this->buffer_manager->_vptr_BufferManager[6])(this->buffer_manager,local_1d8,uVar29)
              ;
              local_1d8->capacity = uVar29;
              optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&result_heap_handle.node);
              iVar23 = local_1d8->byte_offset;
              pdVar31 = (result_heap_handle.node.ptr)->buffer + iVar23;
            }
            local_90 = iVar3;
            piVar18 = local_168;
            if (iVar3 != iVar28) {
              do {
                pbVar12 = local_148;
                uVar29 = (ulong)local_148[iVar28] ^ 1;
                switchD_00b041bd::default
                          (pdVar31,(void *)((long)piVar26 * uVar29 +
                                           (long)piVar18 * (ulong)local_148[iVar28]),
                           next_entry_sizes[iVar28]);
                iVar3 = next_entry_sizes[iVar28];
                pdVar31 = pdVar31 + iVar3;
                bVar1 = pbVar12[iVar28];
                *l_entry_idx = *l_entry_idx + (ulong)bVar1;
                piVar18 = (int *)(iVar3 * bVar1 + (long)piVar18);
                *r_entry_idx = *r_entry_idx + uVar29;
                piVar26 = (int *)(iVar3 * uVar29 + (long)piVar26);
                iVar28 = iVar28 + 1;
              } while (local_90 != iVar28);
              iVar23 = local_1d8->byte_offset;
            }
            local_1d8->count = local_1d8->count + local_a0;
            local_1d8->byte_offset = iVar23 + local_a8;
            l_data = local_178;
            local_168 = piVar18;
            local_130 = pdVar31;
            copied = local_90;
            local_d8 = piVar26;
            goto LAB_00af9745;
          }
        }
        FlushBlobs(this,local_98,piVar19,source_data_ptr,source_entry_idx,
                   (data_ptr_t *)source_heap_ptr,local_170,&local_1a0,local_1d8,&result_heap_handle,
                   &local_130,&copied,local_190);
      }
      else if ((iVar3 == iVar23) || (uVar29 == uVar25)) {
        uVar16 = local_170->capacity - local_170->count;
        if (*local_190 - iVar28 < uVar16) {
          uVar16 = *local_190 - iVar28;
        }
        if (uVar29 == uVar25) {
          uVar29 = iVar27 - *l_entry_idx;
          if (uVar16 < iVar27 - *l_entry_idx) {
            uVar29 = uVar16;
          }
          sVar30 = uVar29 * local_118;
          switchD_00b041bd::default(local_1a0,l_ptr,sVar30);
          local_1a0 = pdVar22 + sVar30;
          l_ptr = pdVar10 + sVar30;
          *l_entry_idx = *l_entry_idx + uVar29;
          piVar19 = &pRVar11->count;
          *piVar19 = *piVar19 + uVar29;
          copied = uVar29 + iVar28;
          l_data = local_178;
        }
        else {
          uVar29 = local_140 - *r_entry_idx;
          if (uVar16 < local_140 - *r_entry_idx) {
            uVar29 = uVar16;
          }
          sVar30 = uVar29 * local_118;
          switchD_00b041bd::default(local_1a0,r_ptr,sVar30);
          local_1a0 = pdVar22 + sVar30;
          r_ptr = pdVar31 + sVar30;
          *r_entry_idx = *r_entry_idx + uVar29;
          piVar19 = &pRVar11->count;
          *piVar19 = *piVar19 + uVar29;
          copied = uVar29 + iVar28;
          l_data = local_178;
        }
      }
      else {
        MergeRows(pMVar14,&l_ptr,l_entry_idx,&local_138,&r_ptr,r_entry_idx,&local_140,local_170,
                  &local_1a0,&row_width,local_148,&copied,local_190);
        l_data = local_178;
      }
LAB_00af9745:
    } while (copied < *local_190);
  }
  if (reset_indices) {
    pSVar17 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
              operator->(local_c0);
    pSVar17->block_idx = iVar6;
    pSVar17->entry_idx = iVar7;
    pSVar17 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
              operator->(local_c8);
    pSVar17->block_idx = iVar8;
    pSVar17->entry_idx = iVar9;
  }
  BufferHandle::~BufferHandle(&result_heap_handle);
  BufferHandle::~BufferHandle(&result_data_handle);
  return;
}

Assistant:

void MergeSorter::MergeData(SortedData &result_data, SortedData &l_data, SortedData &r_data, const idx_t &count,
                            const bool left_smaller[], idx_t next_entry_sizes[], bool reset_indices) {
	auto &l = *left;
	auto &r = *right;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;

	const auto &layout = result_data.layout;
	const idx_t row_width = layout.GetRowWidth();
	const idx_t heap_pointer_offset = layout.GetHeapOffset();

	// Left and right row data to merge
	data_ptr_t l_ptr;
	data_ptr_t r_ptr;
	// Accompanying left and right heap data (if needed)
	data_ptr_t l_heap_ptr;
	data_ptr_t r_heap_ptr;

	// Result rows to write to
	RowDataBlock *result_data_block = result_data.data_blocks.back().get();
	auto result_data_handle = buffer_manager.Pin(result_data_block->block);
	data_ptr_t result_data_ptr = result_data_handle.Ptr() + result_data_block->count * row_width;
	// Result heap to write to (if needed)
	RowDataBlock *result_heap_block = nullptr;
	BufferHandle result_heap_handle;
	data_ptr_t result_heap_ptr;
	if (!layout.AllConstant() && state.external) {
		result_heap_block = result_data.heap_blocks.back().get();
		result_heap_handle = buffer_manager.Pin(result_heap_block->block);
		result_heap_ptr = result_heap_handle.Ptr() + result_heap_block->byte_offset;
	}

	idx_t copied = 0;
	while (copied < count) {
		// Move to new data blocks (if needed)
		if (l.block_idx < l_data.data_blocks.size() && l.entry_idx == l_data.data_blocks[l.block_idx]->count) {
			// Delete reference to previous block
			l_data.data_blocks[l.block_idx]->block = nullptr;
			if (!layout.AllConstant() && state.external) {
				l_data.heap_blocks[l.block_idx]->block = nullptr;
			}
			// Advance block
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_data.data_blocks.size() && r.entry_idx == r_data.data_blocks[r.block_idx]->count) {
			// Delete reference to previous block
			r_data.data_blocks[r.block_idx]->block = nullptr;
			if (!layout.AllConstant() && state.external) {
				r_data.heap_blocks[r.block_idx]->block = nullptr;
			}
			// Advance block
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_data.data_blocks.size();
		const bool r_done = r.block_idx == r_data.data_blocks.size();
		// Pin the row data blocks
		if (!l_done) {
			l.PinData(l_data);
			l_ptr = l.DataPtr(l_data);
		}
		if (!r_done) {
			r.PinData(r_data);
			r_ptr = r.DataPtr(r_data);
		}
		const idx_t &l_count = !l_done ? l_data.data_blocks[l.block_idx]->count : 0;
		const idx_t &r_count = !r_done ? r_data.data_blocks[r.block_idx]->count : 0;
		// Perform the merge
		if (layout.AllConstant() || !state.external) {
			// If all constant size, or if we are doing an in-memory sort, we do not need to touch the heap
			if (!l_done && !r_done) {
				// Both sides have data - merge
				MergeRows(l_ptr, l.entry_idx, l_count, r_ptr, r.entry_idx, r_count, *result_data_block, result_data_ptr,
				          row_width, left_smaller, copied, count);
			} else if (r_done) {
				// Right side is exhausted
				FlushRows(l_ptr, l.entry_idx, l_count, *result_data_block, result_data_ptr, row_width, copied, count);
			} else {
				// Left side is exhausted
				FlushRows(r_ptr, r.entry_idx, r_count, *result_data_block, result_data_ptr, row_width, copied, count);
			}
		} else {
			// External sorting with variable size data. Pin the heap blocks too
			if (!l_done) {
				l_heap_ptr = l.BaseHeapPtr(l_data) + Load<idx_t>(l_ptr + heap_pointer_offset);
				D_ASSERT(l_heap_ptr - l.BaseHeapPtr(l_data) >= 0);
				D_ASSERT((idx_t)(l_heap_ptr - l.BaseHeapPtr(l_data)) < l_data.heap_blocks[l.block_idx]->byte_offset);
			}
			if (!r_done) {
				r_heap_ptr = r.BaseHeapPtr(r_data) + Load<idx_t>(r_ptr + heap_pointer_offset);
				D_ASSERT(r_heap_ptr - r.BaseHeapPtr(r_data) >= 0);
				D_ASSERT((idx_t)(r_heap_ptr - r.BaseHeapPtr(r_data)) < r_data.heap_blocks[r.block_idx]->byte_offset);
			}
			// Both the row and heap data need to be dealt with
			if (!l_done && !r_done) {
				// Both sides have data - merge
				idx_t l_idx_copy = l.entry_idx;
				idx_t r_idx_copy = r.entry_idx;
				data_ptr_t result_data_ptr_copy = result_data_ptr;
				idx_t copied_copy = copied;
				// Merge row data
				MergeRows(l_ptr, l_idx_copy, l_count, r_ptr, r_idx_copy, r_count, *result_data_block,
				          result_data_ptr_copy, row_width, left_smaller, copied_copy, count);
				const idx_t merged = copied_copy - copied;
				// Compute the entry sizes and number of heap bytes that will be copied
				idx_t copy_bytes = 0;
				data_ptr_t l_heap_ptr_copy = l_heap_ptr;
				data_ptr_t r_heap_ptr_copy = r_heap_ptr;
				for (idx_t i = 0; i < merged; i++) {
					// Store base heap offset in the row data
					Store<idx_t>(result_heap_block->byte_offset + copy_bytes, result_data_ptr + heap_pointer_offset);
					result_data_ptr += row_width;
					// Compute entry size and add to total
					const bool &l_smaller = left_smaller[copied + i];
					const bool r_smaller = !l_smaller;
					auto &entry_size = next_entry_sizes[copied + i];
					entry_size =
					    l_smaller * Load<uint32_t>(l_heap_ptr_copy) + r_smaller * Load<uint32_t>(r_heap_ptr_copy);
					D_ASSERT(entry_size >= sizeof(uint32_t));
					D_ASSERT(NumericCast<idx_t>(l_heap_ptr_copy - l.BaseHeapPtr(l_data)) + l_smaller * entry_size <=
					         l_data.heap_blocks[l.block_idx]->byte_offset);
					D_ASSERT(NumericCast<idx_t>(r_heap_ptr_copy - r.BaseHeapPtr(r_data)) + r_smaller * entry_size <=
					         r_data.heap_blocks[r.block_idx]->byte_offset);
					l_heap_ptr_copy += l_smaller * entry_size;
					r_heap_ptr_copy += r_smaller * entry_size;
					copy_bytes += entry_size;
				}
				// Reallocate result heap block size (if needed)
				if (result_heap_block->byte_offset + copy_bytes > result_heap_block->capacity) {
					idx_t new_capacity = result_heap_block->byte_offset + copy_bytes;
					buffer_manager.ReAllocate(result_heap_block->block, new_capacity);
					result_heap_block->capacity = new_capacity;
					result_heap_ptr = result_heap_handle.Ptr() + result_heap_block->byte_offset;
				}
				D_ASSERT(result_heap_block->byte_offset + copy_bytes <= result_heap_block->capacity);
				// Now copy the heap data
				for (idx_t i = 0; i < merged; i++) {
					const bool &l_smaller = left_smaller[copied + i];
					const bool r_smaller = !l_smaller;
					const auto &entry_size = next_entry_sizes[copied + i];
					memcpy(result_heap_ptr,
					       reinterpret_cast<data_ptr_t>(l_smaller * CastPointerToValue(l_heap_ptr) +
					                                    r_smaller * CastPointerToValue(r_heap_ptr)),
					       entry_size);
					D_ASSERT(Load<uint32_t>(result_heap_ptr) == entry_size);
					result_heap_ptr += entry_size;
					l_heap_ptr += l_smaller * entry_size;
					r_heap_ptr += r_smaller * entry_size;
					l.entry_idx += l_smaller;
					r.entry_idx += r_smaller;
				}
				// Update result indices and pointers
				result_heap_block->count += merged;
				result_heap_block->byte_offset += copy_bytes;
				copied += merged;
			} else if (r_done) {
				// Right side is exhausted - flush left
				FlushBlobs(layout, l_count, l_ptr, l.entry_idx, l_heap_ptr, *result_data_block, result_data_ptr,
				           *result_heap_block, result_heap_handle, result_heap_ptr, copied, count);
			} else {
				// Left side is exhausted - flush right
				FlushBlobs(layout, r_count, r_ptr, r.entry_idx, r_heap_ptr, *result_data_block, result_data_ptr,
				           *result_heap_block, result_heap_handle, result_heap_ptr, copied, count);
			}
			D_ASSERT(result_data_block->count == result_heap_block->count);
		}
	}
	if (reset_indices) {
		left->SetIndices(l_block_idx_before, l_entry_idx_before);
		right->SetIndices(r_block_idx_before, r_entry_idx_before);
	}
}